

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_xonly_pubkey_cmp
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pk0,secp256k1_xonly_pubkey *pk1)

{
  int iVar1;
  secp256k1_pubkey *in_RCX;
  int *extraout_RDX;
  byte *output32;
  long lVar2;
  secp256k1_xonly_pubkey *pk [2];
  uchar out [2] [32];
  secp256k1_ge sStack_e0;
  secp256k1_xonly_pubkey *local_68 [2];
  byte local_58 [8];
  undefined8 auStack_50 [3];
  byte abStack_38 [32];
  
  if (ctx != (secp256k1_context *)0x0) {
    local_68[0] = pk0;
    local_68[1] = pk1;
    output32 = local_58;
    lVar2 = 0;
    do {
      iVar1 = secp256k1_xonly_pubkey_serialize(ctx,output32,local_68[lVar2]);
      if (iVar1 == 0) {
        output32[0x10] = 0;
        output32[0x11] = 0;
        output32[0x12] = 0;
        output32[0x13] = 0;
        output32[0x14] = 0;
        output32[0x15] = 0;
        output32[0x16] = 0;
        output32[0x17] = 0;
        output32[0x18] = 0;
        output32[0x19] = 0;
        output32[0x1a] = 0;
        output32[0x1b] = 0;
        output32[0x1c] = 0;
        output32[0x1d] = 0;
        output32[0x1e] = 0;
        output32[0x1f] = 0;
        output32[0] = 0;
        output32[1] = 0;
        output32[2] = 0;
        output32[3] = 0;
        output32[4] = 0;
        output32[5] = 0;
        output32[6] = 0;
        output32[7] = 0;
        output32[8] = 0;
        output32[9] = 0;
        output32[10] = 0;
        output32[0xb] = 0;
        output32[0xc] = 0;
        output32[0xd] = 0;
        output32[0xe] = 0;
        output32[0xf] = 0;
      }
      lVar2 = lVar2 + 1;
      output32 = output32 + 0x20;
    } while (lVar2 == 1);
    lVar2 = 0x20;
    do {
      if (local_58[lVar2 + -0x20] != local_58[lVar2]) {
        return (uint)local_58[lVar2 + -0x20] - (uint)local_58[lVar2];
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    return 0;
  }
  secp256k1_xonly_pubkey_cmp_cold_1();
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_xonly_pubkey_from_pubkey_cold_3();
  }
  else if (pk0 != (secp256k1_xonly_pubkey *)0x0) {
    if (in_RCX == (secp256k1_pubkey *)0x0) {
      secp256k1_xonly_pubkey_from_pubkey_cold_1();
      return 0;
    }
    iVar1 = secp256k1_pubkey_load(ctx,&sStack_e0,in_RCX);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = secp256k1_extrakeys_ge_even_y(&sStack_e0);
    if (extraout_RDX != (int *)0x0) {
      *extraout_RDX = iVar1;
    }
    secp256k1_pubkey_save((secp256k1_pubkey *)pk0,&sStack_e0);
    return 1;
  }
  secp256k1_xonly_pubkey_from_pubkey_cold_2();
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_xonly_pubkey* pk0, const secp256k1_xonly_pubkey* pk1) {
    unsigned char out[2][32];
    const secp256k1_xonly_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pk0; pk[1] = pk1;
    for (i = 0; i < 2; i++) {
        /* If the public key is NULL or invalid, xonly_pubkey_serialize will
         * call the illegal_callback and return 0. In that case we will
         * serialize the key as all zeros which is less than any valid public
         * key. This results in consistent comparisons even if NULL or invalid
         * pubkeys are involved and prevents edge cases such as sorting
         * algorithms that use this function and do not terminate as a
         * result. */
        if (!secp256k1_xonly_pubkey_serialize(ctx, out[i], pk[i])) {
            /* Note that xonly_pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[1]));
}